

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O2

GLuint __thiscall
gl4cts::TextureFilterMinmaxUtils::calcPixelSumValue
          (TextureFilterMinmaxUtils *this,RenderContext *context,GLuint textureId,IVec2 *textureSize
          ,GLenum format,GLenum type)

{
  uint uVar1;
  long lVar2;
  GLuint GVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> textureData;
  Vector<int,_2> local_48;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  
  tcu::Vector<int,_2>::Vector(&local_48,textureSize);
  getDataFromTexture((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_40,
                     (TextureFilterMinmaxUtils *)textureSize,context,textureId,&local_48,format,type
                    );
  GVar3 = 0;
  for (lVar2 = 0;
      (long)local_40._M_impl.super__Vector_impl_data._M_finish -
      (long)local_40._M_impl.super__Vector_impl_data._M_start >> 2 != lVar2; lVar2 = lVar2 + 1) {
    uVar1 = local_40._M_impl.super__Vector_impl_data._M_start[lVar2];
    GVar3 = (uVar1 >> 0x18) + (uVar1 & 0xff) + GVar3 + (uVar1 >> 0x10 & 0xff) + (uVar1 >> 8 & 0xff);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_40);
  return GVar3;
}

Assistant:

glw::GLuint TextureFilterMinmaxUtils::calcPixelSumValue(const glu::RenderContext& context, glw::GLuint textureId,
														tcu::IVec2 textureSize, glw::GLenum format, glw::GLenum type)
{
	std::vector<glw::GLuint> textureData = getDataFromTexture(context, textureId, textureSize, format, type);

	glw::GLuint sum = 0;

	for (size_t texel = 0; texel < textureData.size(); ++texel)
	{
		tcu::RGBA rgba(textureData[texel]);
		sum += rgba.getRed();
		sum += rgba.getGreen();
		sum += rgba.getBlue();
		sum += rgba.getAlpha();
	}

	return sum;
}